

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_cmd.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__nptr;
  bool bVar1;
  int w_00;
  int h_00;
  char *fileName_00;
  Rasterizer *this;
  int iVar2;
  double dVar3;
  double local_158;
  Point poly_1 [2];
  double y1_1;
  double x1_1;
  double y0_2;
  double x0_2;
  Point poly [2];
  double y1;
  double x1;
  double y0_1;
  double x0_1;
  double y0;
  double x0;
  char *value;
  double dStack_a8;
  int index;
  double start [2];
  double line [4];
  Rasterizer *ras;
  Image image;
  uint32_t color;
  char *fileName;
  bool nonZero;
  int h;
  int w;
  int i;
  CmdLine cmd;
  char **argv_local;
  int argc_local;
  
  cmd.argv = argv;
  CmdLine::CmdLine((CmdLine *)&w,argc,argv);
  bVar1 = CmdLine::hasKey((CmdLine *)&w,"--help");
  if ((((bVar1) || (bVar1 = CmdLine::hasKey((CmdLine *)&w,"--width"), !bVar1)) ||
      (bVar1 = CmdLine::hasKey((CmdLine *)&w,"--height"), !bVar1)) ||
     (bVar1 = CmdLine::hasKey((CmdLine *)&w,"--output"), !bVar1)) {
    printf("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]\n");
    argv_local._4_4_ = 1;
  }
  else {
    w_00 = CmdLine::intValueOf((CmdLine *)&w,"--width");
    h_00 = CmdLine::intValueOf((CmdLine *)&w,"--height");
    bVar1 = CmdLine::hasKey((CmdLine *)&w,"--even-odd");
    fileName_00 = CmdLine::valueOf((CmdLine *)&w,"--output");
    image._data._4_4_ = 0xffffffff;
    Image::Image((Image *)&ras);
    Image::create((Image *)&ras,w_00,h_00);
    Image::fillAll((Image *)&ras,0);
    this = Rasterizer::newById((Image *)&ras,1,0);
    Rasterizer::setFillMode(this,(uint)!bVar1);
    value._4_4_ = 0;
    for (h = 1; h < argc; h = h + 1) {
      __nptr = cmd.argv[h];
      if ((*__nptr != '-') || (__nptr[1] != '-')) {
        dVar3 = atof(__nptr);
        iVar2 = value._4_4_ + 1;
        start[(long)value._4_4_ + 1] = dVar3;
        if (iVar2 == 2) {
          dStack_a8 = start[1];
          start[0] = line[0];
          if (((start[1] < 0.0) || (line[0] < 0.0)) ||
             (((double)w_00 < start[1] || ((double)h_00 < line[0])))) {
            printf("Coordinates out of range\n");
            argv_local._4_4_ = 1;
            goto LAB_00102826;
          }
        }
        value._4_4_ = iVar2;
        if (iVar2 == 4) {
          if ((((line[1] < 0.0) || (line[2] < 0.0)) || ((double)w_00 < line[1])) ||
             ((double)h_00 < line[2])) {
            printf("Coordinates out of range\n");
            argv_local._4_4_ = 1;
            goto LAB_00102826;
          }
          x0_2 = start[1];
          poly[0].x = line[0];
          (*this->_vptr_Rasterizer[4])(this,&x0_2,2);
          start[1] = line[1];
          line[0] = line[2];
          value._4_4_ = 2;
        }
      }
    }
    if (1 < value._4_4_) {
      poly_1[1].y = start[0];
      local_158 = start[1];
      poly_1[0].x = line[0];
      poly_1[0].y = dStack_a8;
      poly_1[1].x = start[0];
      (*this->_vptr_Rasterizer[4])(this,&local_158,2);
    }
    (*this->_vptr_Rasterizer[5])(this,(ulong)image._data._4_4_);
    if (this != (Rasterizer *)0x0) {
      (*this->_vptr_Rasterizer[1])();
    }
    bVar1 = Image::writeBmp((Image *)&ras,fileName_00);
    if (bVar1) {
      argv_local._4_4_ = 0;
    }
    else {
      printf("Cannot open file \'%s\' for writing\n",fileName_00);
      argv_local._4_4_ = 1;
    }
LAB_00102826:
    Image::~Image((Image *)&ras);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  CmdLine cmd(argc, argv);
  int i;

  if (cmd.hasKey("--help") ||
     !cmd.hasKey("--width") ||
     !cmd.hasKey("--height") ||
     !cmd.hasKey("--output")) {
    printf("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]\n");
    return 1;
  }

  int w = cmd.intValueOf("--width");
  int h = cmd.intValueOf("--height");
  bool nonZero = !cmd.hasKey("--even-odd");
  const char* fileName = cmd.valueOf("--output");

  uint32_t color = 0xFFFFFFFF;

  Image image;
  image.create(w, h);
  image.fillAll(0);

  // Rasterize the polygon.
  Rasterizer* ras = Rasterizer::newById(image, Rasterizer::kIdA1, 0);
  ras->setFillMode(nonZero ? Rasterizer::kFillNonZero : Rasterizer::kFillEvenOdd);

  double line[4];
  double start[2];
  int index = 0;

  for (i = 1; i < argc; i++) {
    const char* value = argv[i];
    if (value[0] == '-' && value[1] == '-')
      continue;

    // Initial point, required to close the polygon.
    line[index++] = atof(value);
    if (index == 2) {
      double x0 = line[0];
      double y0 = line[1];

      start[0] = x0;
      start[1] = y0;

      if (x0 < 0 || y0 < 0 || x0 > w || y0 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }
    }

    if (index == 4) {
      double x0 = line[0];
      double y0 = line[1];
      double x1 = line[2];
      double y1 = line[3];

      if (x1 < 0 || y1 < 0 || x1 > w || y1 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }

      Point poly[] = { { x0, y0 }, { x1, y1 } };
      ras->addPoly(poly, 2);

      line[0] = x1;
      line[1] = y1;
      index = 2;
    }
  }

  // Close the polygon
  if (index >= 2) {
    double x0 = line[0];
    double y0 = line[1];
    double x1 = start[0];
    double y1 = start[1];

    Point poly[] = { { x0, y0 }, { x1, y1 } };
    ras->addPoly(poly, 2);
  }

  ras->render(color);
  delete ras;

  if (!image.writeBmp(fileName)) {
    printf("Cannot open file '%s' for writing\n", fileName);
    return 1;
  }

  return 0;
}